

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::startAnalyticCenterComputation(HighsMipSolverData *this,TaskGroup *taskGroup)

{
  __atomic_base<int> _Var1;
  HighsSplitDeque *this_00;
  element_type *peVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  anon_class_8_1_8991fb9c_for_functor local_10;
  
  this_00 = taskGroup->workerDeque;
  uVar3 = (this_00->ownerData).head;
  uVar4 = (ulong)uVar3;
  local_10.this = this;
  if (uVar4 < 0x2000) {
    uVar5 = (uint32_t)(uVar4 + 1);
    (this_00->ownerData).head = uVar5;
    (this_00->taskArray)._M_elems[uVar4].metadata.stealer.super___atomic_base<unsigned_long>._M_i =
         0;
    *(undefined ***)(this_00->taskArray)._M_elems[uVar4].taskData = &PTR_operator___004330f0;
    *(HighsMipSolverData **)((this_00->taskArray)._M_elems[uVar4].taskData + 8) = this;
    if ((this_00->ownerData).allStolenCopy != true) {
      HighsSplitDeque::growShared(this_00);
      return;
    }
    (this_00->stealerData).ts.super___atomic_base<unsigned_long>._M_i = uVar4 << 0x20 | uVar4 + 1;
    (this_00->stealerData).allStolen._M_base._M_i = false;
    (this_00->ownerData).splitCopy = uVar5;
    (this_00->ownerData).allStolenCopy = false;
    if (((this_00->splitRequest)._M_base._M_i & 1U) != 0) {
      (this_00->splitRequest)._M_base._M_i = false;
    }
    peVar2 = (this_00->ownerData).workerBunk.
             super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LOCK();
    _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
    (peVar2->haveJobs).super___atomic_base<int>._M_i =
         (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (_Var1._M_i < (this_00->ownerData).numWorkers + -1) {
      HighsSplitDeque::WorkerBunk::publishWork
                ((this_00->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this_00);
      return;
    }
  }
  else {
    if (((this_00->ownerData).splitCopy < 0x2000) && ((this_00->ownerData).allStolenCopy == false))
    {
      HighsSplitDeque::growShared(this_00);
      uVar3 = (this_00->ownerData).head;
    }
    (this_00->ownerData).head = uVar3 + 1;
    HighsTask::
    Callable<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsMipSolverData.cpp:296:19)>
    ::anon_class_8_1_8991fb9c_for_functor::operator()(&local_10);
  }
  return;
}

Assistant:

void HighsMipSolverData::startAnalyticCenterComputation(
    const highs::parallel::TaskGroup& taskGroup) {
  taskGroup.spawn([&]() {
    // first check if the analytic centre computation should be cancelled, e.g.
    // due to early return in the root node evaluation
    Highs ipm;
    ipm.setOptionValue("solver", "ipm");
    ipm.setOptionValue("run_crossover", kHighsOffString);
    ipm.setOptionValue("presolve", kHighsOffString);
    ipm.setOptionValue("output_flag", false);
    // ipm.setOptionValue("output_flag", !mipsolver.submip);
    ipm.setOptionValue("ipm_iteration_limit", 200);
    HighsLp lpmodel(*mipsolver.model_);
    lpmodel.col_cost_.assign(lpmodel.num_col_, 0.0);
    ipm.passModel(std::move(lpmodel));

    //    if (!mipsolver.submip) {
    //      const std::string file_name = mipsolver.model_->model_name_ +
    //      "_ipm.mps"; printf("Calling ipm.writeModel(%s)\n",
    //      file_name.c_str()); fflush(stdout); ipm.writeModel(file_name);
    //    }

    mipsolver.analysis_.mipTimerStart(kMipClockIpmSolveLp);
    ipm.run();
    mipsolver.analysis_.mipTimerStop(kMipClockIpmSolveLp);
    const std::vector<double>& sol = ipm.getSolution().col_value;
    if (HighsInt(sol.size()) != mipsolver.numCol()) return;
    analyticCenterStatus = ipm.getModelStatus();
    analyticCenter = sol;
  });
}